

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

uint __thiscall
flatbuffers::FlatBufferBuilderImpl<true>::PushElement<unsigned_long,unsigned_int>
          (FlatBufferBuilderImpl<true> *this,unsigned_long element)

{
  type tVar1;
  unsigned_long local_20;
  unsigned_long local_18;
  unsigned_long element_local;
  FlatBufferBuilderImpl<true> *this_local;
  
  local_18 = element;
  element_local = (unsigned_long)this;
  AssertScalarT<unsigned_long>(this);
  Align(this,8);
  local_20 = EndianScalar<unsigned_long>(local_18);
  vector_downward<unsigned_long>::push_small<unsigned_long>(&this->buf_,&local_20);
  tVar1 = CalculateOffset<unsigned_int>(this);
  return tVar1;
}

Assistant:

ReturnT PushElement(T element) {
    AssertScalarT<T>();
    Align(sizeof(T));
    buf_.push_small(EndianScalar(element));
    return CalculateOffset<ReturnT>();
  }